

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

void __thiscall Handler::Output(Handler *this,uint16_t *startDay,uint16_t *endDay)

{
  pointer pRVar1;
  pointer pEVar2;
  pointer pMVar3;
  char *pcVar4;
  pointer pRVar5;
  uint uVar6;
  ostream *poVar7;
  ulong uVar8;
  ExtendResult *extendRes;
  pointer pEVar9;
  MigrateResult *migrateRes;
  pointer pMVar10;
  pointer pRVar11;
  vector<ExtendResult,_std::allocator<ExtendResult>_> *__range2;
  
  for (uVar8 = (ulong)*startDay; uVar8 < *endDay; uVar8 = uVar8 + 1) {
    pRVar1 = (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
             super__Vector_impl_data._M_start;
    poVar7 = std::operator<<((ostream *)&std::cout,"(purchase, ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,")\n");
    pEVar2 = *(pointer *)
              ((long)&pRVar1[uVar8].extendResult.
                      super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl + 8);
    for (pEVar9 = *(pointer *)
                   &pRVar1[uVar8].extendResult.
                    super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl;
        pEVar9 != pEVar2; pEVar9 = pEVar9 + 1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"(");
      poVar7 = std::operator<<(poVar7,(string *)
                                      ((this->servers).
                                       super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
                                       super__Vector_impl_data._M_start + pEVar9->serverIdx));
      poVar7 = std::operator<<(poVar7,", ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pEVar9->purchaseNum);
      std::operator<<(poVar7,")\n");
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"(migration, ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,")\n");
    pMVar3 = *(pointer *)
              ((long)&pRVar1[uVar8].migrateResult.
                      super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>._M_impl + 8)
    ;
    for (pMVar10 = pRVar1[uVar8].migrateResult.
                   super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>._M_impl.
                   super__Vector_impl_data._M_start; pMVar10 != pMVar3; pMVar10 = pMVar10 + 1) {
      uVar6 = pMVar10->location - NODE_A;
      if (uVar6 < 3) {
        pcVar4 = (&PTR_anon_var_dwarf_1dc24_00117d78)[uVar6];
        poVar7 = std::operator<<((ostream *)&std::cout,"(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pMVar10->vmId);
        poVar7 = std::operator<<(poVar7,", ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pMVar10->purchasedServerId);
        std::operator<<(poVar7,pcVar4);
      }
    }
    pRVar5 = *(pointer *)
              ((long)&pRVar1[uVar8].requestResult.
                      super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl + 8)
    ;
    for (pRVar11 = pRVar1[uVar8].requestResult.
                   super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl.
                   super__Vector_impl_data._M_start; pRVar11 != pRVar5; pRVar11 = pRVar11 + 1) {
      uVar6 = pRVar11->location - NODE_A;
      if (uVar6 < 3) {
        pcVar4 = (&PTR_anon_var_dwarf_1dc24_00117d78)[uVar6];
        poVar7 = std::operator<<((ostream *)&std::cout,"(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pRVar11->purchasedServerId);
        std::operator<<(poVar7,pcVar4);
      }
    }
  }
  fflush(_stdout);
  return;
}

Assistant:

void Handler::Output(const uint16_t &startDay, const uint16_t &endDay) {
    for (uint16_t i = startDay; i < endDay; ++i) {
        const Result &res = result[i];

        // 扩容结果
        const std::vector<ExtendResult> &extendResult = res.extendResult;
        std::cout << "(purchase, " << extendResult.size() << ")\n";
        for (const ExtendResult &extendRes : extendResult) {
            std::cout << "(" << servers[extendRes.serverIdx].model << ", " << extendRes.purchaseNum << ")\n";
        }

        // 迁移结果
        const std::vector<MigrateResult> &migrateResult = res.migrateResult;
        std::cout << "(migration, " << migrateResult.size() << ")\n";
        for (const MigrateResult &migrateRes : migrateResult) {
            if (migrateRes.location == ALL) {
                std::cout << "(" << migrateRes.vmId << ", " << migrateRes.purchasedServerId << ")\n";
            } else if (migrateRes.location == NODE_A) {
                std::cout << "(" << migrateRes.vmId << ", " << migrateRes.purchasedServerId << ", A)\n";
            } else if (migrateRes.location == NODE_B) {
                std::cout << "(" << migrateRes.vmId << ", " << migrateRes.purchasedServerId << ", B)\n";
            }
        }

        // 部署结果
        const std::vector<RequestResult> &requestResult = res.requestResult;
        for (const RequestResult &requestRes : requestResult) {
            if (requestRes.location == ALL) {
                std::cout << "(" << requestRes.purchasedServerId << ")\n";
            } else if (requestRes.location == NODE_A) {
                std::cout << "(" << requestRes.purchasedServerId << ", A)\n";
            } else if (requestRes.location == NODE_B) {
                std::cout << "(" << requestRes.purchasedServerId << ", B)\n";
            }
        }
    }

    fflush(stdout);
}